

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  byte bVar1;
  int iVar2;
  CURLMcode CVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Curl_easy *data;
  easy_pollset ps;
  easy_pollset local_58;
  
  CVar3 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar3 = CURLM_RECURSIVE_API_CALL, (multi->field_0x1b1 & 4) == 0)) {
    local_58.sockets[4] = 0;
    local_58.num = 0;
    local_58.actions[0] = '\0';
    local_58.actions[1] = '\0';
    local_58.actions[2] = '\0';
    local_58.actions[3] = '\0';
    local_58.actions[4] = '\0';
    local_58._29_3_ = 0;
    local_58.sockets[0] = 0;
    local_58.sockets[1] = 0;
    local_58.sockets[2] = 0;
    local_58.sockets[3] = 0;
    data = multi->easyp;
    if (data == (Curl_easy *)0x0) {
      iVar5 = -1;
    }
    else {
      iVar5 = -1;
      do {
        multi_getsock(data,&local_58);
        if ((ulong)local_58._16_8_ >> 0x20 != 0) {
          uVar4 = 0;
          do {
            iVar2 = local_58.sockets[uVar4];
            if (iVar2 < 0x400) {
              bVar1 = local_58.actions[uVar4];
              if ((bVar1 & 1) != 0) {
                iVar6 = iVar2 + 0x3f;
                if (-1 < iVar2) {
                  iVar6 = iVar2;
                }
                read_fd_set->fds_bits[iVar6 >> 6] =
                     read_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f);
              }
              if ((bVar1 & 2) != 0) {
                iVar6 = iVar2 + 0x3f;
                if (-1 < iVar2) {
                  iVar6 = iVar2;
                }
                write_fd_set->fds_bits[iVar6 >> 6] =
                     write_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar2 & 0x3f);
              }
              if (iVar5 < iVar2) {
                iVar5 = iVar2;
              }
            }
            uVar4 = uVar4 + 1;
          } while ((ulong)local_58._16_8_ >> 0x20 != uVar4);
        }
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    *max_fd = iVar5;
    CVar3 = CURLM_OK;
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  struct easy_pollset ps;
  unsigned int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  memset(&ps, 0, sizeof(ps));
  for(data = multi->easyp; data; data = data->next) {
    multi_getsock(data, &ps);

    for(i = 0; i < ps.num; i++) {
      if(!FDSET_SOCK(ps.sockets[i]))
        /* pretend it doesn't exist */
        continue;
      if(ps.actions[i] & CURL_POLL_IN)
        FD_SET(ps.sockets[i], read_fd_set);
      if(ps.actions[i] & CURL_POLL_OUT)
        FD_SET(ps.sockets[i], write_fd_set);
      if((int)ps.sockets[i] > this_max_fd)
        this_max_fd = (int)ps.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}